

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_RegisterNodes
               (UA_Server *server,UA_Session *session,UA_RegisterNodesRequest *request,
               UA_RegisterNodesResponse *response)

{
  UA_StatusCode UVar1;
  UA_DateTime UVar2;
  uint local_68;
  uint local_60;
  uint local_5c;
  UA_RegisterNodesResponse *response_local;
  UA_RegisterNodesRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_60 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_5c = 0;
    }
    else {
      local_5c = session->channel->connection->sockfd;
    }
    local_60 = local_5c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing RegisterNodesRequest"
               ,(ulong)local_60,(ulong)local_68,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  UVar2 = UA_DateTime_now();
  (response->responseHeader).timestamp = UVar2;
  if (request->nodesToRegisterSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    UVar1 = UA_Array_copy(request->nodesToRegister,request->nodesToRegisterSize,
                          &response->registeredNodeIds,UA_TYPES + 0x10);
    (response->responseHeader).serviceResult = UVar1;
    if ((response->responseHeader).serviceResult == 0) {
      response->registeredNodeIdsSize = request->nodesToRegisterSize;
    }
  }
  return;
}

Assistant:

void Service_RegisterNodes(UA_Server *server, UA_Session *session, const UA_RegisterNodesRequest *request,
                           UA_RegisterNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing RegisterNodesRequest");
    //TODO: hang the nodeids to the session if really needed
    response->responseHeader.timestamp = UA_DateTime_now();
    if(request->nodesToRegisterSize <= 0)
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
    else {
        response->responseHeader.serviceResult =
            UA_Array_copy(request->nodesToRegister, request->nodesToRegisterSize,
                          (void**)&response->registeredNodeIds, &UA_TYPES[UA_TYPES_NODEID]);
        if(response->responseHeader.serviceResult == UA_STATUSCODE_GOOD)
            response->registeredNodeIdsSize = request->nodesToRegisterSize;
    }
}